

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::TransRangeList
          (TransRangeList *this,TransRangeSyntax *syntax,Type *type,ASTContext *context)

{
  TokenKind TVar1;
  size_t sVar2;
  TransRepeatRangeSyntax *pTVar3;
  SelectorSyntax *pSVar4;
  RepeatKind RVar5;
  int iVar6;
  ExpressionSyntax *syntax_00;
  undefined4 extraout_var;
  Expression *pEVar7;
  Type *src;
  Type *extraout_RDX;
  size_t extraout_RDX_00;
  RangeSelectSyntax *rss;
  Compilation *dst;
  const_iterator __begin2;
  Expression *local_78;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  
  this->repeatFrom = (Expression *)0x0;
  this->repeatTo = (Expression *)0x0;
  (this->items)._M_ptr = (pointer)0x0;
  (this->items)._M_extent._M_extent_value = 0;
  this->repeatKind = None;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  __begin2.index = 0;
  buffer.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  sVar2 = (syntax->items).elements._M_extent._M_extent_value;
  src = type;
  __begin2.list = &syntax->items;
  for (; (__begin2.list != &syntax->items || (__begin2.index != sVar2 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    syntax_00 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference(&__begin2);
    local_78 = bindCovergroupExpr(syntax_00,context,type,(bitmask<slang::ast::ASTFlags>)0x0);
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)&buffer,&local_78);
    src = extraout_RDX;
  }
  dst = ((context->scope).ptr)->compilation;
  iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
  (this->items)._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
  (this->items)._M_extent._M_extent_value = extraout_RDX_00;
  pTVar3 = syntax->repeat;
  if (pTVar3 != (TransRepeatRangeSyntax *)0x0) {
    TVar1 = (pTVar3->specifier).kind;
    if (TVar1 == Star) {
      RVar5 = Consecutive;
    }
    else if (TVar1 == MinusArrow) {
      RVar5 = GoTo;
    }
    else {
      RVar5 = Nonconsecutive;
    }
    this->repeatKind = RVar5;
    pSVar4 = pTVar3->selector;
    __begin2.list = (ParentList *)context;
    if (pSVar4 != (SelectorSyntax *)0x0) {
      dst = *(Compilation **)&pSVar4[1].super_SyntaxNode;
      if ((pSVar4->super_SyntaxNode).kind == BitSelect) {
        pEVar7 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)&__begin2,(ExpressionSyntax *)dst);
        this->repeatFrom = pEVar7;
      }
      else {
        pEVar7 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)&__begin2,(ExpressionSyntax *)dst);
        this->repeatFrom = pEVar7;
        dst = *(Compilation **)&pSVar4[2].super_SyntaxNode;
        pEVar7 = TransRangeList::anon_class_8_1_bc11688f::operator()
                           ((anon_class_8_1_bc11688f *)&__begin2,(ExpressionSyntax *)dst);
        this->repeatTo = pEVar7;
      }
    }
  }
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup
            (&buffer.super_SmallVectorBase<const_slang::ast::Expression_*>,(EVP_PKEY_CTX *)dst);
  return;
}

Assistant:

CoverageBinSymbol::TransRangeList::TransRangeList(const TransRangeSyntax& syntax, const Type& type,
                                                  const ASTContext& context) {
    SmallVector<const Expression*> buffer;
    for (auto elem : syntax.items) {
        auto& expr = bindCovergroupExpr(*elem, context, &type);
        buffer.push_back(&expr);
    }

    auto& comp = context.getCompilation();
    items = buffer.copy(comp);

    if (syntax.repeat) {
        switch (syntax.repeat->specifier.kind) {
            case TokenKind::Star:
                repeatKind = Consecutive;
                break;
            case TokenKind::Equals:
                repeatKind = Nonconsecutive;
                break;
            case TokenKind::MinusArrow:
                repeatKind = GoTo;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        auto bindCount = [&](const ExpressionSyntax& exprSyntax) {
            auto& expr = bindCovergroupExpr(exprSyntax, context);
            context.requireIntegral(expr);
            return &expr;
        };

        if (auto sel = syntax.repeat->selector) {
            if (sel->kind == SyntaxKind::BitSelect) {
                repeatFrom = bindCount(*sel->as<BitSelectSyntax>().expr);
            }
            else {
                auto& rss = sel->as<RangeSelectSyntax>();
                repeatFrom = bindCount(*rss.left);
                repeatTo = bindCount(*rss.right);
            }
        }
    }
}